

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O0

tuple<double,_double> bounds<double>(double y)

{
  double dVar1;
  int __x;
  tuple<double,_double> *in_RDI;
  double *__a;
  double in_XMM0_Qa;
  double dVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  _Tuple_impl<1UL,_double> extraout_XMM0_Qa_01;
  _Head_base<0UL,_double,_false> _Var3;
  tuple<double,_double> tVar4;
  double y_max;
  double y_min;
  double min;
  double eps;
  double tol;
  tuple<double,_double> *__a1;
  tuple<double,_double> *this;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  __a1 = in_RDI;
  this = in_RDI;
  local_10 = in_XMM0_Qa;
  dVar2 = log2(2.0);
  __x = (int)in_RDI;
  local_18 = dVar2 * 53.0;
  local_20 = Catch::clara::std::numeric_limits<double>::epsilon();
  dVar1 = local_18;
  local_20 = dVar2 * 53.0 * local_20;
  local_28 = std::numeric_limits<double>::min();
  local_28 = dVar1 * local_28;
  local_30 = (1.0 - local_20) * local_10;
  local_38 = (local_20 + 1.0) * local_10;
  if (local_38 < local_30) {
    __a = &local_30;
    std::swap<double>(__a,&local_38);
    __x = (int)__a;
  }
  Catch::clara::std::abs(__x);
  if (extraout_XMM0_Qa < local_28) {
    local_30 = -local_28;
  }
  Catch::clara::std::abs(__x);
  if (extraout_XMM0_Qa_00 < local_28) {
    local_38 = local_28;
  }
  _Var3._M_head_impl = extraout_XMM0_Qa_00;
  std::tuple<double,_double>::tuple<double_&,_double_&,_true>
            (this,(double *)__a1,(double *)0x3cc85c);
  tVar4.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl =
       _Var3._M_head_impl;
  tVar4.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
  super__Head_base<1UL,_double,_false>._M_head_impl =
       extraout_XMM0_Qa_01.super__Head_base<1UL,_double,_false>._M_head_impl;
  return (tuple<double,_double>)tVar4.super__Tuple_impl<0UL,_double,_double>;
}

Assistant:

std::tuple<T, T> bounds(T y) {
  const T tol{std::numeric_limits<T>::digits *
              std::log2(static_cast<T>(std::numeric_limits<T>::radix))};
  const T eps{tol * std::numeric_limits<T>::epsilon()};
  const T min{tol * std::numeric_limits<T>::min()};
  T y_min{(1 - eps) * y};
  T y_max{(1 + eps) * y};
  if (y_min > y_max)
    std::swap(y_min, y_max);
  if (std::abs(y_min) < min)
    y_min = -min;
  if (std::abs(y_max) < min)
    y_max = +min;
  return {y_min, y_max};
}